

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.h
# Opt level: O2

int sortMoves(moves *moveList,int bestMove)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uStack_50;
  int aiStack_48 [2];
  ulong local_40;
  int local_34;
  
  uVar1 = moveList->count;
  uVar4 = (ulong)uVar1;
  lVar6 = -(uVar4 * 4 + 0xf & 0xfffffffffffffff0);
  lVar2 = lVar6 + -0x48;
  uVar10 = 0;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 6;
  local_40 = *(ulong *)((long)&uStack_50 + lVar6);
  if (side != 0) {
    local_40 = uVar10;
  }
  *(undefined8 *)((long)&uStack_50 + lVar6) = 0xb;
  uVar13 = *(ulong *)((long)&uStack_50 + lVar6);
  *(undefined8 *)((long)&uStack_50 + lVar6) = 5;
  uVar12 = *(ulong *)((long)&uStack_50 + lVar6);
  if (side == 0) {
    uVar12 = uVar13;
  }
  uVar13 = 0;
  if (0 < (int)uVar1) {
    uVar13 = (ulong)uVar1;
  }
  lVar8 = (long)ply;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 1;
  lVar6 = *(long *)((long)&uStack_50 + lVar6);
  iVar9 = scorePV;
  do {
    if (uVar10 == uVar13) {
      for (lVar8 = 0; lVar7 = lVar6, lVar8 < (int)uVar4; lVar8 = lVar8 + 1) {
        for (; (int)lVar7 < (int)uVar4; lVar7 = lVar7 + 1) {
          iVar9 = *(int *)((long)aiStack_48 + lVar8 * 4 + lVar2 + 0x48);
          iVar5 = *(int *)((long)aiStack_48 + lVar7 * 4 + lVar2 + 0x48);
          if (iVar9 < iVar5) {
            *(int *)((long)aiStack_48 + lVar8 * 4 + lVar2 + 0x48) = iVar5;
            *(int *)((long)aiStack_48 + lVar7 * 4 + lVar2 + 0x48) = iVar9;
            iVar9 = moveList->moves[lVar8];
            moveList->moves[lVar8] = moveList->moves[lVar7];
            moveList->moves[lVar7] = iVar9;
            uVar4 = (ulong)(uint)moveList->count;
          }
        }
        lVar6 = lVar6 + 1;
      }
      return (int)uVar4;
    }
    uVar1 = moveList->moves[uVar10];
    iVar5 = 30000;
    if (uVar1 != bestMove) {
      if ((iVar9 == 0) || (pvTable[0][lVar8] != uVar1)) {
        if ((uVar1 >> 0x14 & 1) == 0) {
          iVar5 = 9000;
          if ((killerMoves[0][lVar8] != uVar1) && (iVar5 = 8000, killerMoves[1][lVar8] != uVar1)) {
            iVar5 = *(int *)((long)historyMoves[0] +
                            (ulong)(uVar1 >> 4 & 0xfc) + (ulong)(uVar1 >> 4 & 0xf00));
          }
        }
        else {
          local_34 = iVar9;
          uVar3 = local_40;
          do {
            uVar11 = uVar3;
            if (uVar12 < uVar11) {
              uVar11 = 0;
              break;
            }
            uVar3 = uVar11 + 1;
          } while ((bitboardsPieces[uVar11] & lVar6 << ((byte)(uVar1 >> 6) & 0x3f)) == 0);
          iVar5 = MVV_LVA[uVar1 >> 0xc & 0xf][uVar11] + 10000;
        }
      }
      else {
        scorePV = 0;
        iVar9 = 0;
        iVar5 = 20000;
      }
    }
    *(int *)((long)aiStack_48 + uVar10 * 4 + lVar2 + 0x48) = iVar5;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static inline int sortMoves(moves *moveList,int bestMove) {
    int moveScores[moveList->count];
    for (int i = 0; i < moveList->count; i++) {
        // if best move -> give A LOT of score
        if(bestMove == moveList->moves[i]){
            moveScores[i] = 30000;
        }
        else{
            // for each move, calculate score
            moveScores[i] = scoreMove(moveList->moves[i]);
        }
    }


    // bubble sort according to score. bigger score first, smaller score last
    for (int current_move = 0; current_move < moveList->count; current_move++) {
        for (int next_move = current_move + 1; next_move < moveList->count; next_move++) {

            if (moveScores[current_move] < moveScores[next_move]) {
                // swap scores
                int tempScore = moveScores[current_move];
                moveScores[current_move] = moveScores[next_move];
                moveScores[next_move] = tempScore;

                // swap moves
                int tempMove = moveList->moves[current_move];
                moveList->moves[current_move] = moveList->moves[next_move];
                moveList->moves[next_move] = tempMove;
            }
        }
    }
    return 1;
}